

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_header.c
# Opt level: O1

exr_result_t
extract_attr_chlist(exr_context_t ctxt,_internal_exr_seq_scratch *scratch,
                   exr_attr_chlist_t *attrdata,char *aname,char *tname,int32_t attrsz)

{
  int32_t namelen;
  exr_result_t eVar1;
  int iVar2;
  exr_pixel_type_t local_160;
  int32_t chlen;
  uint local_158;
  int32_t local_154;
  int32_t local_150;
  uint8_t flags [4];
  char chname [256];
  
  local_158 = (uint)ctxt->max_name_length;
  eVar1 = check_bad_attrsz(scratch,attrsz,1,aname,tname,&chlen);
  if (0 < attrsz && eVar1 == 0) {
    while( true ) {
      chlen = 0;
      eVar1 = read_text(chname,&chlen,local_158,scratch,aname);
      namelen = chlen;
      if (eVar1 != 0) break;
      iVar2 = attrsz + ~chlen;
      attrsz = iVar2;
      if (chlen == 0) {
        eVar1 = 0;
        break;
      }
      if (iVar2 < 0x10) {
        (*scratch->sequential_skip)(scratch,iVar2);
        eVar1 = (*ctxt->print_error)
                          (ctxt,0x11,"Out of data parsing \'%s\', last channel \'%s\'",aname,chname)
        ;
        return eVar1;
      }
      eVar1 = (*scratch->sequential_read)(scratch,&local_160,4);
      if ((((eVar1 != 0) || (eVar1 = (*scratch->sequential_read)(scratch,flags,4), eVar1 != 0)) ||
          (eVar1 = (*scratch->sequential_read)(scratch,&local_150,4), eVar1 != 0)) ||
         (eVar1 = (*scratch->sequential_read)(scratch,&local_154,4), eVar1 != 0)) break;
      if (EXR_PIXEL_LAST_TYPE < local_160) {
        local_160 = EXR_PIXEL_LAST_TYPE;
      }
      attrsz = iVar2 + -0x10;
      eVar1 = exr_attr_chlist_add_with_length
                        (ctxt,attrdata,chname,namelen,local_160,(uint)flags[0],local_150,local_154);
      if ((eVar1 != 0) || (iVar2 == 0x10)) break;
    }
  }
  (*scratch->sequential_skip)(scratch,attrsz);
  return eVar1;
}

Assistant:

static exr_result_t
extract_attr_chlist (
    exr_context_t                     ctxt,
    struct _internal_exr_seq_scratch* scratch,
    exr_attr_chlist_t*                attrdata,
    const char*                       aname,
    const char*                       tname,
    int32_t                           attrsz)
{
    char         chname[256];
    int32_t      chlen;
    int32_t      ptype, xsamp, ysamp;
    uint8_t      flags[4];
    int32_t      maxlen = ctxt->max_name_length;
    exr_result_t rv;

    rv = check_bad_attrsz (scratch, attrsz, 1, aname, tname, &chlen);

    while (rv == EXR_ERR_SUCCESS && attrsz > 0)
    {
        chlen = 0;
        rv    = read_text (chname, &chlen, maxlen, scratch, aname);
        if (rv != EXR_ERR_SUCCESS) break;
        attrsz -= chlen + 1;

        if (chlen == 0) break;

        if (attrsz < 16)
        {
            scratch->sequential_skip (scratch, attrsz);
            return ctxt->print_error (
                ctxt,
                EXR_ERR_ATTR_SIZE_MISMATCH,
                "Out of data parsing '%s', last channel '%s'",
                aname,
                chname);
        }

        rv = scratch->sequential_read (scratch, &ptype, 4);
        if (rv != EXR_ERR_SUCCESS) break;
        rv = scratch->sequential_read (scratch, &flags, 4);
        if (rv != EXR_ERR_SUCCESS) break;
        rv = scratch->sequential_read (scratch, &xsamp, 4);
        if (rv != EXR_ERR_SUCCESS) break;
        rv = scratch->sequential_read (scratch, &ysamp, 4);
        if (rv != EXR_ERR_SUCCESS) break;

        attrsz -= 16;
        ptype = (int32_t) one_to_native32 ((uint32_t) ptype);
        xsamp = (int32_t) one_to_native32 ((uint32_t) xsamp);
        ysamp = (int32_t) one_to_native32 ((uint32_t) ysamp);

        if (ptype < 0 || ptype > (int)EXR_PIXEL_LAST_TYPE)
            ptype = (int)EXR_PIXEL_LAST_TYPE;

        rv = exr_attr_chlist_add_with_length (
            ctxt,
            attrdata,
            chname,
            chlen,
            (exr_pixel_type_t) ptype,
            flags[0],
            xsamp,
            ysamp);
    }
    scratch->sequential_skip (scratch, attrsz);
    return rv;
}